

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::_load_bmp(CImg<unsigned_char> *this,FILE *file,char *filename)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uchar uVar4;
  uint uVar5;
  uint uVar6;
  ushort uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  CImgArgumentException *this_00;
  char *pcVar11;
  char *pcVar12;
  uchar *puVar13;
  CImgIOException *pCVar14;
  long lVar15;
  unsigned_long *puVar16;
  uchar *puVar17;
  size_t sVar18;
  byte *pbVar19;
  byte local_2c4;
  int local_254;
  int local_24c;
  char *local_1e8;
  FILE *local_1b0;
  uint local_16c;
  uint local_168;
  int x_5;
  int y_5;
  int x_4;
  int y_4;
  unsigned_short col_3;
  uchar c2;
  uchar c1;
  int x_3;
  int y_3;
  uchar *col_2;
  int x_2;
  int y_2;
  uchar *col_1;
  byte local_12e;
  uchar color;
  int x_1;
  uchar val_1;
  uchar mask_1;
  uchar *puStack_128;
  int y_1;
  uchar *col;
  byte local_116;
  byte local_115;
  int x;
  uchar val;
  uchar mask;
  int y;
  ushort *local_108;
  uchar *ptrs;
  undefined1 local_f8 [8];
  CImg<unsigned_char> buffer;
  undefined1 local_d0 [4];
  int xoffset;
  CImg<int> colormap;
  unsigned_long local_a8;
  unsigned_long local_a0;
  ulongT buf_size;
  ulongT cimg_iobuffer;
  int align_bytes;
  int dx_bytes;
  int bpp;
  int nb_colors;
  int compression;
  int dy;
  int dx;
  int header_size;
  int offset;
  int file_size;
  CImg<unsigned_char> header;
  FILE *nfile;
  char *filename_local;
  FILE *file_local;
  CImg<unsigned_char> *this_local;
  
  if ((file == (FILE *)0x0) && (filename == (char *)0x0)) {
    this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x10);
    uVar10 = this->_width;
    uVar8 = this->_height;
    uVar5 = this->_depth;
    uVar6 = this->_spectrum;
    puVar13 = this->_data;
    pcVar11 = "non-";
    if ((this->_is_shared & 1U) != 0) {
      pcVar11 = "";
    }
    pcVar12 = pixel_type();
    CImgArgumentException::CImgArgumentException
              (this_00,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_bmp(): Specified filename is (null)."
               ,(ulong)uVar10,(ulong)uVar8,(ulong)uVar5,(ulong)uVar6,puVar13,pcVar11,pcVar12);
    __cxa_throw(this_00,&CImgArgumentException::typeinfo,
                CImgArgumentException::~CImgArgumentException);
  }
  local_1b0 = (FILE *)file;
  if (file == (FILE *)0x0) {
    local_1b0 = cimg::fopen(filename,"rb");
  }
  header._data = (uchar *)local_1b0;
  CImg((CImg<unsigned_char> *)&offset,0x36,1,1,1);
  cimg::fread<unsigned_char>((uchar *)header._16_8_,0x36,(FILE *)header._data);
  puVar13 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)&offset);
  if ((*puVar13 != 'B') ||
     (puVar13 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)&offset),
     puVar13[1] != 'M')) {
    if (file == (FILE *)0x0) {
      cimg::fclose((FILE *)header._data);
    }
    pCVar14 = (CImgIOException *)__cxa_allocate_exception(0x10);
    uVar10 = this->_width;
    uVar8 = this->_height;
    uVar5 = this->_depth;
    uVar6 = this->_spectrum;
    puVar13 = this->_data;
    pcVar11 = "non-";
    if ((this->_is_shared & 1U) != 0) {
      pcVar11 = "";
    }
    pcVar12 = pixel_type();
    local_1e8 = filename;
    if (filename == (char *)0x0) {
      local_1e8 = "(FILE*)";
    }
    CImgIOException::CImgIOException
              (pCVar14,
               "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_bmp(): Invalid BMP file \'%s\'.",
               (ulong)uVar10,(ulong)uVar8,(ulong)uVar5,(ulong)uVar6,puVar13,pcVar11,pcVar12,
               local_1e8);
    __cxa_throw(pCVar14,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
  }
  puVar13 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)&offset);
  bVar1 = puVar13[2];
  puVar13 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)&offset);
  bVar2 = puVar13[3];
  puVar13 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)&offset);
  bVar3 = puVar13[4];
  puVar13 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)&offset);
  header_size = (uint)bVar1 + (uint)bVar2 * 0x100 + (uint)bVar3 * 0x10000 +
                (uint)puVar13[5] * 0x1000000;
  puVar13 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)&offset);
  bVar1 = puVar13[10];
  puVar13 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)&offset);
  bVar2 = puVar13[0xb];
  puVar13 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)&offset);
  bVar3 = puVar13[0xc];
  puVar13 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)&offset);
  dx = (uint)bVar1 + (uint)bVar2 * 0x100 + (uint)bVar3 * 0x10000 + (uint)puVar13[0xd] * 0x1000000;
  puVar13 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)&offset);
  bVar1 = puVar13[0xe];
  puVar13 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)&offset);
  bVar2 = puVar13[0xf];
  puVar13 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)&offset);
  bVar3 = puVar13[0x10];
  puVar13 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)&offset);
  dy = (uint)bVar1 + (uint)bVar2 * 0x100 + (uint)bVar3 * 0x10000 + (uint)puVar13[0x11] * 0x1000000;
  puVar13 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)&offset);
  bVar1 = puVar13[0x12];
  puVar13 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)&offset);
  bVar2 = puVar13[0x13];
  puVar13 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)&offset);
  bVar3 = puVar13[0x14];
  puVar13 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)&offset);
  compression = (uint)bVar1 + (uint)bVar2 * 0x100 + (uint)bVar3 * 0x10000 +
                (uint)puVar13[0x15] * 0x1000000;
  puVar13 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)&offset);
  bVar1 = puVar13[0x16];
  puVar13 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)&offset);
  bVar2 = puVar13[0x17];
  puVar13 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)&offset);
  bVar3 = puVar13[0x18];
  puVar13 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)&offset);
  nb_colors = (uint)bVar1 + (uint)bVar2 * 0x100 + (uint)bVar3 * 0x10000 +
              (uint)puVar13[0x19] * 0x1000000;
  puVar13 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)&offset);
  bVar1 = puVar13[0x1e];
  puVar13 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)&offset);
  bVar2 = puVar13[0x1f];
  puVar13 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)&offset);
  bVar3 = puVar13[0x20];
  puVar13 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)&offset);
  bpp = (uint)bVar1 + (uint)bVar2 * 0x100 + (uint)bVar3 * 0x10000 + (uint)puVar13[0x21] * 0x1000000;
  puVar13 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)&offset);
  bVar1 = puVar13[0x2e];
  puVar13 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)&offset);
  bVar2 = puVar13[0x2f];
  puVar13 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)&offset);
  bVar3 = puVar13[0x30];
  puVar13 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)&offset);
  dx_bytes = (uint)bVar1 + (uint)bVar2 * 0x100 + (uint)bVar3 * 0x10000 +
             (uint)puVar13[0x31] * 0x1000000;
  puVar13 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)&offset);
  bVar1 = puVar13[0x1c];
  puVar13 = cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)&offset);
  align_bytes = (uint)bVar1 + (uint)puVar13[0x1d] * 0x100;
  if ((header_size == 0) || (header_size == dx)) {
    cimg::fseek((FILE *)header._data,0,2);
    lVar15 = cimg::ftell((FILE *)header._data);
    header_size = (int)lVar15;
    cimg::fseek((FILE *)header._data,0x36,0);
  }
  if (0x28 < dy) {
    cimg::fseek((FILE *)header._data,(long)(dy + -0x28),1);
  }
  if (align_bytes == 1) {
    local_24c = compression / 8 + (uint)(compression % 8 != 0);
  }
  else {
    if (align_bytes == 4) {
      local_254 = compression / 2 + compression % 2;
    }
    else {
      local_254 = (int)(((long)compression * (long)align_bytes) / 8);
    }
    local_24c = local_254;
  }
  cimg_iobuffer._4_4_ = local_24c;
  uVar8 = 4 - local_24c % 4;
  uVar10 = uVar8;
  if ((int)uVar8 < 0) {
    uVar10 = 7 - local_24c % 4;
  }
  cimg_iobuffer._0_4_ = uVar8 - (uVar10 & 0xfffffffc);
  buf_size = 0x1800000;
  iVar9 = cimg::abs(nb_colors);
  local_a8 = (long)iVar9 * (long)(cimg_iobuffer._4_4_ + (int)cimg_iobuffer);
  colormap._data = (int *)((long)header_size - (long)dx);
  puVar16 = std::min<unsigned_long>(&local_a8,(unsigned_long *)&colormap._data);
  local_a0 = *puVar16;
  CImg<int>::CImg((CImg<int> *)local_d0);
  if (align_bytes < 0x10) {
    if (dx_bytes == 0) {
      dx_bytes = 1 << ((byte)align_bytes & 0x1f);
    }
  }
  else {
    dx_bytes = 0;
  }
  if (dx_bytes != 0) {
    CImg<int>::assign((CImg<int> *)local_d0,dx_bytes,1,1,1);
    cimg::fread<int>((int *)colormap._16_8_,(long)dx_bytes,(FILE *)header._data);
  }
  buffer._data._4_4_ = ((dx + -0xe) - dy) + dx_bytes * -4;
  if (0 < buffer._data._4_4_) {
    cimg::fseek((FILE *)header._data,(long)buffer._data._4_4_,1);
  }
  CImg((CImg<unsigned_char> *)local_f8);
  if (local_a0 < 0x1800000) {
    ptrs._7_1_ = 0;
    assign((CImg<unsigned_char> *)local_f8,(uint)local_a0,1,1,1,(uchar *)((long)&ptrs + 7));
    cimg::fread<unsigned_char>((uchar *)buffer._16_8_,local_a0,(FILE *)header._data);
  }
  else {
    assign((CImg<unsigned_char> *)local_f8,cimg_iobuffer._4_4_ + (int)cimg_iobuffer,1,1,1);
  }
  local_108 = (ushort *)cimg_library::CImg::operator_cast_to_unsigned_char_((CImg *)local_f8);
  iVar9 = compression;
  if ((bpp == 1) || (bpp == 2)) {
    if (file != (FILE *)0x0) {
      pCVar14 = (CImgIOException *)__cxa_allocate_exception(0x10);
      uVar10 = this->_width;
      uVar8 = this->_height;
      uVar5 = this->_depth;
      uVar6 = this->_spectrum;
      puVar13 = this->_data;
      pcVar11 = "non-";
      if ((this->_is_shared & 1U) != 0) {
        pcVar11 = "";
      }
      pcVar12 = pixel_type();
      CImgIOException::CImgIOException
                (pCVar14,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::load_bmp(): Unable to load compressed data from \'(*FILE)\' inputs."
                 ,(ulong)uVar10,(ulong)uVar8,(ulong)uVar5,(ulong)uVar6,puVar13,pcVar11,pcVar12);
      __cxa_throw(pCVar14,&CImgIOException::typeinfo,CImgIOException::~CImgIOException);
    }
    cimg::fclose((FILE *)header._data);
    this_local = load_other(this,filename);
  }
  else {
    uVar10 = cimg::abs(nb_colors);
    mask = '\0';
    assign(this,iVar9,uVar10,1,3,&mask);
    switch(align_bytes) {
    case 1:
      if (1 < (uint)local_d0) {
        x = height(this);
        while (x = x + -1, -1 < x) {
          if (0x17fffff < local_a0) {
            local_108 = (ushort *)buffer._16_8_;
            sVar18 = cimg::fread<unsigned_char>
                               ((uchar *)buffer._16_8_,(long)cimg_iobuffer._4_4_,
                                (FILE *)header._data);
            if (sVar18 == 0) break;
            cimg::fseek((FILE *)header._data,(long)(int)cimg_iobuffer,1);
          }
          local_115 = 0x80;
          local_116 = 0;
          for (col._4_4_ = 0; (int)col._4_4_ < (int)this->_width; col._4_4_ = col._4_4_ + 1) {
            if (local_115 == 0x80) {
              local_116 = (byte)*local_108;
              local_108 = (ushort *)((long)local_108 + 1);
            }
            puVar13 = (uchar *)(colormap._16_8_ + (ulong)((local_116 & local_115) != 0) * 4);
            puStack_128 = puVar13 + 1;
            uVar4 = *puVar13;
            puVar13 = operator()(this,col._4_4_,x,2);
            *puVar13 = uVar4;
            uVar4 = *puStack_128;
            puStack_128 = puStack_128 + 1;
            puVar13 = operator()(this,col._4_4_,x,1);
            *puVar13 = uVar4;
            uVar4 = *puStack_128;
            puStack_128 = puStack_128 + 1;
            puVar13 = operator()(this,col._4_4_,x,0);
            *puVar13 = uVar4;
            local_115 = cimg::ror<unsigned_char>(&local_115,1);
          }
          local_108 = (ushort *)((long)local_108 + (long)(int)cimg_iobuffer);
        }
      }
      break;
    case 4:
      if (0xf < (uint)local_d0) {
        x_1 = height(this);
        while (x_1 = x_1 + -1, -1 < x_1) {
          if (0x17fffff < local_a0) {
            local_108 = (ushort *)buffer._16_8_;
            sVar18 = cimg::fread<unsigned_char>
                               ((uchar *)buffer._16_8_,(long)cimg_iobuffer._4_4_,
                                (FILE *)header._data);
            if (sVar18 == 0) break;
            cimg::fseek((FILE *)header._data,(long)(int)cimg_iobuffer,1);
          }
          color = 0xf0;
          local_12e = 0;
          for (col_1._4_4_ = 0; (int)col_1._4_4_ < (int)this->_width; col_1._4_4_ = col_1._4_4_ + 1)
          {
            if (color == 0xf0) {
              local_12e = (byte)*local_108;
              local_108 = (ushort *)((long)local_108 + 1);
            }
            if (color < 0x10) {
              local_2c4 = local_12e & color;
            }
            else {
              local_2c4 = (byte)((int)(uint)(local_12e & color) >> 4);
            }
            puVar13 = (uchar *)(colormap._16_8_ + (ulong)local_2c4 * 4);
            uVar4 = *puVar13;
            puVar17 = operator()(this,col_1._4_4_,x_1,2);
            *puVar17 = uVar4;
            uVar4 = puVar13[1];
            puVar17 = operator()(this,col_1._4_4_,x_1,1);
            *puVar17 = uVar4;
            uVar4 = puVar13[2];
            puVar13 = operator()(this,col_1._4_4_,x_1,0);
            *puVar13 = uVar4;
            color = cimg::ror<unsigned_char>(&color,4);
          }
          local_108 = (ushort *)((long)local_108 + (long)(int)cimg_iobuffer);
        }
      }
      break;
    case 8:
      if (0xff < (uint)local_d0) {
        col_2._4_4_ = height(this);
        while (col_2._4_4_ = col_2._4_4_ - 1, -1 < (int)col_2._4_4_) {
          if (0x17fffff < local_a0) {
            local_108 = (ushort *)buffer._16_8_;
            sVar18 = cimg::fread<unsigned_char>
                               ((uchar *)buffer._16_8_,(long)cimg_iobuffer._4_4_,
                                (FILE *)header._data);
            if (sVar18 == 0) break;
            cimg::fseek((FILE *)header._data,(long)(int)cimg_iobuffer,1);
          }
          for (col_2._0_4_ = 0; (int)(uint)col_2 < (int)this->_width; col_2._0_4_ = (uint)col_2 + 1)
          {
            puVar13 = (uchar *)(colormap._16_8_ + (long)(int)(uint)(byte)*local_108 * 4);
            uVar4 = *puVar13;
            local_108 = (ushort *)((long)local_108 + 1);
            puVar17 = operator()(this,(uint)col_2,col_2._4_4_,2);
            *puVar17 = uVar4;
            uVar4 = puVar13[1];
            puVar17 = operator()(this,(uint)col_2,col_2._4_4_,1);
            *puVar17 = uVar4;
            uVar4 = puVar13[2];
            puVar13 = operator()(this,(uint)col_2,col_2._4_4_,0);
            *puVar13 = uVar4;
          }
          local_108 = (ushort *)((long)local_108 + (long)(int)cimg_iobuffer);
        }
      }
      break;
    case 0x10:
      _col_3 = height(this);
      while (_col_3 = _col_3 - 1, -1 < (int)_col_3) {
        if (0x17fffff < local_a0) {
          local_108 = (ushort *)buffer._16_8_;
          sVar18 = cimg::fread<unsigned_char>
                             ((uchar *)buffer._16_8_,(long)cimg_iobuffer._4_4_,(FILE *)header._data)
          ;
          if (sVar18 == 0) break;
          cimg::fseek((FILE *)header._data,(long)(int)cimg_iobuffer,1);
        }
        for (y_4 = 0; y_4 < (int)this->_width; y_4 = y_4 + 1) {
          uVar7 = *local_108;
          local_108 = local_108 + 1;
          puVar13 = operator()(this,y_4,_col_3,2);
          *puVar13 = (uchar)((uVar7 & 0x1f) << 3);
          puVar13 = operator()(this,y_4,_col_3,1);
          *puVar13 = (uchar)(((int)(uint)uVar7 >> 5 & 0x3fU) << 3);
          puVar13 = operator()(this,y_4,_col_3,0);
          *puVar13 = (uchar)(((int)(uint)uVar7 >> 0xb) << 3);
        }
        local_108 = (ushort *)((long)local_108 + (long)(int)cimg_iobuffer);
      }
      break;
    case 0x18:
      y_5 = height(this);
      while (y_5 = y_5 + -1, -1 < y_5) {
        if (0x17fffff < local_a0) {
          local_108 = (ushort *)buffer._16_8_;
          sVar18 = cimg::fread<unsigned_char>
                             ((uchar *)buffer._16_8_,(long)cimg_iobuffer._4_4_,(FILE *)header._data)
          ;
          if (sVar18 == 0) break;
          cimg::fseek((FILE *)header._data,(long)(int)cimg_iobuffer,1);
        }
        for (x_5 = 0; x_5 < (int)this->_width; x_5 = x_5 + 1) {
          uVar7 = *local_108;
          local_108 = (ushort *)((long)local_108 + 1);
          pbVar19 = operator()(this,x_5,y_5,2);
          *pbVar19 = (byte)uVar7;
          uVar7 = *local_108;
          local_108 = (ushort *)((long)local_108 + 1);
          pbVar19 = operator()(this,x_5,y_5,1);
          *pbVar19 = (byte)uVar7;
          uVar7 = *local_108;
          local_108 = (ushort *)((long)local_108 + 1);
          pbVar19 = operator()(this,x_5,y_5,0);
          *pbVar19 = (byte)uVar7;
        }
        local_108 = (ushort *)((long)local_108 + (long)(int)cimg_iobuffer);
      }
      break;
    case 0x20:
      local_168 = height(this);
      while (local_168 = local_168 - 1, -1 < (int)local_168) {
        if (0x17fffff < local_a0) {
          local_108 = (ushort *)buffer._16_8_;
          sVar18 = cimg::fread<unsigned_char>
                             ((uchar *)buffer._16_8_,(long)cimg_iobuffer._4_4_,(FILE *)header._data)
          ;
          if (sVar18 == 0) break;
          cimg::fseek((FILE *)header._data,(long)(int)cimg_iobuffer,1);
        }
        for (local_16c = 0; (int)local_16c < (int)this->_width; local_16c = local_16c + 1) {
          uVar7 = *local_108;
          local_108 = (ushort *)((long)local_108 + 1);
          pbVar19 = operator()(this,local_16c,local_168,2);
          *pbVar19 = (byte)uVar7;
          uVar7 = *local_108;
          local_108 = (ushort *)((long)local_108 + 1);
          pbVar19 = operator()(this,local_16c,local_168,1);
          *pbVar19 = (byte)uVar7;
          uVar7 = *local_108;
          local_108 = (ushort *)((long)local_108 + 1);
          pbVar19 = operator()(this,local_16c,local_168,0);
          *pbVar19 = (byte)uVar7;
          local_108 = (ushort *)((long)local_108 + 1);
        }
        local_108 = (ushort *)((long)local_108 + (long)(int)cimg_iobuffer);
      }
    }
    if (nb_colors < 0) {
      mirror(this,'y');
    }
    this_local = this;
    if (file == (FILE *)0x0) {
      cimg::fclose((FILE *)header._data);
    }
  }
  y = 1;
  ~CImg((CImg<unsigned_char> *)local_f8);
  CImg<int>::~CImg((CImg<int> *)local_d0);
  ~CImg((CImg<unsigned_char> *)&offset);
  return this_local;
}

Assistant:

CImg<T>& _load_bmp(std::FILE *const file, const char *const filename) {
      if (!file && !filename)
        throw CImgArgumentException(_cimg_instance
                                    "load_bmp(): Specified filename is (null).",
                                    cimg_instance);

      std::FILE *const nfile = file?file:cimg::fopen(filename,"rb");
      CImg<ucharT> header(54);
      cimg::fread(header._data,54,nfile);
      if (*header!='B' || header[1]!='M') {
        if (!file) cimg::fclose(nfile);
        throw CImgIOException(_cimg_instance
                              "load_bmp(): Invalid BMP file '%s'.",
                              cimg_instance,
                              filename?filename:"(FILE*)");
      }

      // Read header and pixel buffer
      int
        file_size = header[0x02] + (header[0x03]<<8) + (header[0x04]<<16) + (header[0x05]<<24),
        offset = header[0x0A] + (header[0x0B]<<8) + (header[0x0C]<<16) + (header[0x0D]<<24),
        header_size = header[0x0E] + (header[0x0F]<<8) + (header[0x10]<<16) + (header[0x11]<<24),
        dx = header[0x12] + (header[0x13]<<8) + (header[0x14]<<16) + (header[0x15]<<24),
        dy = header[0x16] + (header[0x17]<<8) + (header[0x18]<<16) + (header[0x19]<<24),
        compression = header[0x1E] + (header[0x1F]<<8) + (header[0x20]<<16) + (header[0x21]<<24),
        nb_colors = header[0x2E] + (header[0x2F]<<8) + (header[0x30]<<16) + (header[0x31]<<24),
        bpp = header[0x1C] + (header[0x1D]<<8);

      if (!file_size || file_size==offset) {
        cimg::fseek(nfile,0,SEEK_END);
        file_size = (int)cimg::ftell(nfile);
        cimg::fseek(nfile,54,SEEK_SET);
      }
      if (header_size>40) cimg::fseek(nfile,header_size - 40,SEEK_CUR);

      const int
        dx_bytes = (bpp==1)?(dx/8 + (dx%8?1:0)):((bpp==4)?(dx/2 + (dx%2)):(int)((longT)dx*bpp/8)),
        align_bytes = (4 - dx_bytes%4)%4;
      const ulongT
        cimg_iobuffer = (ulongT)24*1024*1024,
        buf_size = std::min((ulongT)cimg::abs(dy)*(dx_bytes + align_bytes),(ulongT)file_size - offset);

      CImg<intT> colormap;
      if (bpp<16) { if (!nb_colors) nb_colors = 1<<bpp; } else nb_colors = 0;
      if (nb_colors) { colormap.assign(nb_colors); cimg::fread(colormap._data,nb_colors,nfile); }
      const int xoffset = offset - 14 - header_size - 4*nb_colors;
      if (xoffset>0) cimg::fseek(nfile,xoffset,SEEK_CUR);

      CImg<ucharT> buffer;
      if (buf_size<cimg_iobuffer) {
        buffer.assign(buf_size,1,1,1,0);
        cimg::fread(buffer._data,buf_size,nfile);
      } else buffer.assign(dx_bytes + align_bytes);
      unsigned char *ptrs = buffer;

      // Decompress buffer (if necessary)
      if (compression==1 || compression==2) {
        if (file)
          throw CImgIOException(_cimg_instance
                                "load_bmp(): Unable to load compressed data from '(*FILE)' inputs.",
                                cimg_instance);
        else {
          if (!file) cimg::fclose(nfile);
          return load_other(filename);
        }
      }

      // Read pixel data
      assign(dx,cimg::abs(dy),1,3,0);
      switch (bpp) {
      case 1 : { // Monochrome
        if (colormap._width>=2) for (int y = height() - 1; y>=0; --y) {
          if (buf_size>=cimg_iobuffer) {
            if (!cimg::fread(ptrs=buffer._data,dx_bytes,nfile)) break;
            cimg::fseek(nfile,align_bytes,SEEK_CUR);
          }
          unsigned char mask = 0x80, val = 0;
          cimg_forX(*this,x) {
            if (mask==0x80) val = *(ptrs++);
            const unsigned char *col = (unsigned char*)(colormap._data + (val&mask?1:0));
            (*this)(x,y,2) = (T)*(col++);
            (*this)(x,y,1) = (T)*(col++);
            (*this)(x,y,0) = (T)*(col++);
            mask = cimg::ror(mask);
          }
          ptrs+=align_bytes;
        }
      } break;
      case 4 : { // 16 colors
        if (colormap._width>=16) for (int y = height() - 1; y>=0; --y) {
          if (buf_size>=cimg_iobuffer) {
            if (!cimg::fread(ptrs=buffer._data,dx_bytes,nfile)) break;
            cimg::fseek(nfile,align_bytes,SEEK_CUR);
          }
          unsigned char mask = 0xF0, val = 0;
          cimg_forX(*this,x) {
            if (mask==0xF0) val = *(ptrs++);
            const unsigned char color = (unsigned char)((mask<16)?(val&mask):((val&mask)>>4));
            const unsigned char *col = (unsigned char*)(colormap._data + color);
            (*this)(x,y,2) = (T)*(col++);
            (*this)(x,y,1) = (T)*(col++);
            (*this)(x,y,0) = (T)*(col++);
            mask = cimg::ror(mask,4);
          }
          ptrs+=align_bytes;
        }
      } break;
      case 8 : { // 256 colors
        if (colormap._width>=256) for (int y = height() - 1; y>=0; --y) {
          if (buf_size>=cimg_iobuffer) {
            if (!cimg::fread(ptrs=buffer._data,dx_bytes,nfile)) break;
            cimg::fseek(nfile,align_bytes,SEEK_CUR);
          }
          cimg_forX(*this,x) {
            const unsigned char *col = (unsigned char*)(colormap._data + *(ptrs++));
            (*this)(x,y,2) = (T)*(col++);
            (*this)(x,y,1) = (T)*(col++);
            (*this)(x,y,0) = (T)*(col++);
          }
          ptrs+=align_bytes;
        }
      } break;
      case 16 : { // 16 bits colors (RGB565)
        for (int y = height() - 1; y>=0; --y) {
          if (buf_size>=cimg_iobuffer) {
            if (!cimg::fread(ptrs=buffer._data,dx_bytes,nfile)) break;
            cimg::fseek(nfile,align_bytes,SEEK_CUR);
          }
          cimg_forX(*this,x) {
            const unsigned char c1 = *(ptrs++), c2 = *(ptrs++);
            const unsigned short col = (unsigned short)c2<<8 | c1;
            (*this)(x,y,2) = (T)((col&0x1F)<<3);
            (*this)(x,y,1) = (T)(((col>>5)&0x3F)<<3);
            (*this)(x,y,0) = (T)(((col>>11)&0x1F)<<3);
          }
          ptrs+=align_bytes;
        }
      } break;
      case 24 : { // 24 bits colors
        for (int y = height() - 1; y>=0; --y) {
          if (buf_size>=cimg_iobuffer) {
            if (!cimg::fread(ptrs=buffer._data,dx_bytes,nfile)) break;
            cimg::fseek(nfile,align_bytes,SEEK_CUR);
          }
          cimg_forX(*this,x) {
            (*this)(x,y,2) = (T)*(ptrs++);
            (*this)(x,y,1) = (T)*(ptrs++);
            (*this)(x,y,0) = (T)*(ptrs++);
          }
          ptrs+=align_bytes;
        }
      } break;
      case 32 : { // 32 bits colors
        for (int y = height() - 1; y>=0; --y) {
          if (buf_size>=cimg_iobuffer) {
            if (!cimg::fread(ptrs=buffer._data,dx_bytes,nfile)) break;
            cimg::fseek(nfile,align_bytes,SEEK_CUR);
          }
          cimg_forX(*this,x) {
            (*this)(x,y,2) = (T)*(ptrs++);
            (*this)(x,y,1) = (T)*(ptrs++);
            (*this)(x,y,0) = (T)*(ptrs++);
            ++ptrs;
          }
          ptrs+=align_bytes;
        }
      } break;
      }